

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanIdentifierContinue
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,bool identifyKwds,bool fHasEscape,
          bool fHasMultiChar,EncodedCharPtr pchMin,EncodedCharPtr p,EncodedCharPtr *pp)

{
  EncodedCharPtr last;
  size_t sVar1;
  Token *pTVar2;
  LPCOLESTR prgch;
  code *pcVar3;
  EncodedCharPtr puVar4;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_00;
  bool bVar5;
  bool isStrictMode;
  BOOL BVar6;
  tokens tVar7;
  uint32 cch;
  undefined4 *puVar8;
  IdentPtr this_01;
  EncodedCharPtr local_50;
  EncodedCharPtr p_local;
  codepoint_t codePoint;
  bool fHasMultiChar_local;
  bool local_31 [8];
  bool fHasEscape_local;
  
  last = this->m_pchLast;
  local_50 = p;
  p_local._7_1_ = fHasMultiChar;
  _codePoint = this;
  local_31[0] = fHasEscape;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    BVar6 = FastIdentifierContinue(_codePoint,&local_50,last);
    puVar4 = local_50;
    if (BVar6 != 0) goto LAB_00d55aa6;
    p_local._0_4_ = 0xffffffff;
    sVar1 = (_codePoint->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
    bVar5 = TryReadCodePoint<true>
                      (_codePoint,&local_50,last,(codepoint_t *)&p_local,local_31,
                       (bool *)((long)&p_local + 7));
    if (!bVar5) break;
    if (0x10ffff < (uint)p_local) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x1e3,"(codePoint < 0x110000u)","codePoint < 0x110000u");
      if (!bVar5) goto LAB_00d55d9c;
      *puVar8 = 0;
    }
    bVar5 = Js::CharClassifier::IsIdContinue(_codePoint->charClassifier,(uint)p_local);
  } while (bVar5);
  (_codePoint->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = sVar1;
LAB_00d55aa6:
  _codePoint->field_0x508 = _codePoint->field_0x508 & 0xef | local_31[0] << 4;
  local_50 = puVar4;
  if ((ulong)((long)pchMin - (long)puVar4) < 0xffffffff80000001) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x1f2,"(p - pchMin > 0 && p - pchMin <= 2147483647L)",
                       "p - pchMin > 0 && p - pchMin <= LONG_MAX");
    if (!bVar5) goto LAB_00d55d9c;
    *puVar8 = 0;
  }
  this_00 = _codePoint;
  *pp = local_50;
  if (!identifyKwds) {
    return tkID;
  }
  if (((p_local._7_1_ | local_31[0]) & 1) == 0) {
    cch = UnescapeToTempBuf(_codePoint,pchMin,local_50);
    prgch = (this_00->m_tempChBuf).m_prgch;
    bVar5 = IsStrictMode(this_00);
    tVar7 = Ident::TkFromNameLen(prgch,cch,bVar5);
    if (tVar7 == tkAWAIT) {
      if ((_codePoint->m_fAwaitIsKeywordRegion == false) && ((_codePoint->field_0x508 & 1) == 0))
      goto LAB_00d55c95;
    }
    else if ((tVar7 == tkID) || ((tVar7 == tkYIELD && (bVar5 = YieldIsKeyword(_codePoint), !bVar5)))
            ) goto LAB_00d55c95;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x204,
                       "(tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword()))"
                       ,
                       "tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword())"
                      );
    if (bVar5) {
      *puVar8 = 0;
LAB_00d55c95:
      pTVar2 = _codePoint->m_ptoken;
      (pTVar2->u).field_0.pid = (IdentPtr)0x0;
      (pTVar2->u).field_0.pchMin = (char *)pchMin;
      (pTVar2->u).field_0.length = (int)local_50 - (int)pchMin;
      return tkID;
    }
  }
  else {
    this_01 = PidOfIdentiferAt(_codePoint,pchMin,local_50,(bool)((~p_local._7_1_ | local_31[0]) & 1)
                               ,(bool)p_local._7_1_);
    bVar5 = local_31[0];
    pTVar2 = this_00->m_ptoken;
    (pTVar2->u).field_0.pid = this_01;
    (pTVar2->u).field_0.pchMin = (char *)0x0;
    isStrictMode = IsStrictMode(this_00);
    tVar7 = Ident::Tk(this_01,isStrictMode);
    if (bVar5 != false) {
      if (tVar7 == tkAWAIT) {
        tVar7 = tkID;
        if ((_codePoint->field_0x508 & 1) != 0) {
          tVar7 = tkNone;
        }
        if (_codePoint->m_fAwaitIsKeywordRegion != false) {
          return tkNone;
        }
        return tVar7;
      }
      if (tVar7 == tkID) {
        return tkID;
      }
      if ((tVar7 == tkYIELD) && (bVar5 = YieldIsKeyword(_codePoint), !bVar5)) {
        return tkID;
      }
      return tkNone;
    }
    if (tVar7 == tkID) {
      return tkID;
    }
    bVar5 = IsStrictMode(_codePoint);
    tVar7 = Ident::Tk(this_01,bVar5);
    if ((tVar7 == tkYIELD) && (bVar5 = YieldIsKeyword(_codePoint), !bVar5)) {
      return tkID;
    }
    bVar5 = IsStrictMode(_codePoint);
    tVar7 = Ident::Tk(this_01,bVar5);
    if (((tVar7 == tkAWAIT) && (_codePoint->m_fAwaitIsKeywordRegion == false)) &&
       ((_codePoint->field_0x508 & 1) == 0)) {
      return tkID;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x215,
                       "(pid->Tk(IsStrictMode()) == tkID || (pid->Tk(IsStrictMode()) == tkYIELD && !this->YieldIsKeyword()) || (pid->Tk(IsStrictMode()) == tkAWAIT && !this->AwaitIsKeyword()))"
                       ,
                       "pid->Tk(IsStrictMode()) == tkID || (pid->Tk(IsStrictMode()) == tkYIELD && !this->YieldIsKeyword()) || (pid->Tk(IsStrictMode()) == tkAWAIT && !this->AwaitIsKeyword())"
                      );
    if (bVar5) {
      *puVar8 = 0;
      return tkID;
    }
  }
LAB_00d55d9c:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanIdentifierContinue(bool identifyKwds, bool fHasEscape, bool fHasMultiChar,
    EncodedCharPtr pchMin, EncodedCharPtr p, EncodedCharPtr *pp)
{
    EncodedCharPtr last = m_pchLast;

    while (true)
    {
        // Fast path for utf8, non-multi unit char and not escape
        if (FastIdentifierContinue(p, last))
        {
            break;
        }

        // Slow path that has to deal with multi unit encoding
        codepoint_t codePoint = INVALID_CODEPOINT;
        EncodedCharPtr pchBeforeLast = p;
        size_t multiUnitsBeforeLast = this->m_cMultiUnits;
        if (TryReadCodePoint<true>(p, last, &codePoint, &fHasEscape, &fHasMultiChar))
        {
            Assert(codePoint < 0x110000u);
            if (charClassifier->IsIdContinue(codePoint))
            {
                continue;
            }
        }

        // Put back the last character
        p = pchBeforeLast;
        this->RestoreMultiUnits(multiUnitsBeforeLast);
        break;
    }

    m_lastIdentifierHasEscape = fHasEscape;

    Assert(p - pchMin > 0 && p - pchMin <= LONG_MAX);

    *pp = p;

    if (!identifyKwds)
    {
        return tkID;
    }

    // UTF16 Scanner are only for syntax coloring, so it shouldn't come here.
    if (EncodingPolicy::MultiUnitEncoding && !fHasMultiChar && !fHasEscape)
    {
        Assert(sizeof(EncodedChar) == 1);

        // If there are no escape, that the main scan loop would have found the keyword already
        // So we can just assume it is an ID
        DebugOnly(int32 cch = UnescapeToTempBuf(pchMin, p));
        DebugOnly(tokens tk = Ident::TkFromNameLen(m_tempChBuf.m_prgch, cch, IsStrictMode()));
        Assert(tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword()));

        m_ptoken->SetIdentifier(reinterpret_cast<const char *>(pchMin), (int32)(p - pchMin));
        return tkID;
    }

    IdentPtr pid = PidOfIdentiferAt(pchMin, p, fHasEscape, fHasMultiChar);
    m_ptoken->SetIdentifier(pid);

    if (!fHasEscape)
    {
        // If it doesn't have escape, then Scan() should have taken care of keywords (except
        // yield if m_fYieldIsKeyword is false, in which case yield is treated as an identifier, and except
        // await if m_fAwaitIsKeyword is false, in which case await is treated as an identifier).
        // We don't have to check if the name is reserved word and return it as an Identifier
        Assert(pid->Tk(IsStrictMode()) == tkID
            || (pid->Tk(IsStrictMode()) == tkYIELD && !this->YieldIsKeyword())
            || (pid->Tk(IsStrictMode()) == tkAWAIT && !this->AwaitIsKeyword()));
        return tkID;
    }
    tokens tk = pid->Tk(IsStrictMode());
    return tk == tkID || (tk == tkYIELD && !this->YieldIsKeyword()) || (tk == tkAWAIT && !this->AwaitIsKeyword()) ? tkID : tkNone;
}